

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O0

void __thiscall btMultiBodyDynamicsWorld::clearMultiBodyForces(btMultiBodyDynamicsWorld *this)

{
  btMultiBody *this_00;
  bool bVar1;
  int iVar2;
  btMultiBody *this_01;
  btMultiBodyLinkCollider *pbVar3;
  btCollisionObject *this_02;
  btMultibodyLink *pbVar4;
  long in_RDI;
  btMultiBody *bod_1;
  int b;
  bool isSleeping;
  btMultiBody *bod;
  int i;
  CProfileSample __profile;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  btMultiBody *in_stack_ffffffffffffff70;
  int local_30;
  int local_10;
  
  CProfileSample::CProfileSample
            ((CProfileSample *)in_stack_ffffffffffffff70,
             (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_10 = 0;
  while( true ) {
    iVar2 = btAlignedObjectArray<btMultiBody_*>::size
                      ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 0x1c8));
    if (iVar2 <= local_10) break;
    this_01 = (btMultiBody *)
              btAlignedObjectArray<btMultiBody_*>::operator[]
                        ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 0x1c8),local_10);
    this_00 = (btMultiBody *)this_01->_vptr_btMultiBody;
    bVar1 = false;
    pbVar3 = btMultiBody::getBaseCollider(this_00);
    if (pbVar3 != (btMultiBodyLinkCollider *)0x0) {
      this_02 = (btCollisionObject *)btMultiBody::getBaseCollider(this_00);
      iVar2 = btCollisionObject::getActivationState(this_02);
      if (iVar2 == 2) {
        bVar1 = true;
      }
    }
    local_30 = 0;
    while( true ) {
      iVar2 = btMultiBody::getNumLinks((btMultiBody *)0x2515f8);
      if (iVar2 <= local_30) break;
      pbVar4 = btMultiBody::getLink(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      if (pbVar4->m_collider != (btMultiBodyLinkCollider *)0x0) {
        pbVar4 = btMultiBody::getLink(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        iVar2 = btCollisionObject::getActivationState((btCollisionObject *)pbVar4->m_collider);
        if (iVar2 == 2) {
          bVar1 = true;
        }
      }
      local_30 = local_30 + 1;
    }
    if (!bVar1) {
      in_stack_ffffffffffffff70 =
           (btMultiBody *)
           btAlignedObjectArray<btMultiBody_*>::operator[]
                     ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 0x1c8),local_10);
      btMultiBody::clearForcesAndTorques(this_01);
    }
    local_10 = local_10 + 1;
  }
  CProfileSample::~CProfileSample((CProfileSample *)0x2516e0);
  return;
}

Assistant:

void btMultiBodyDynamicsWorld::clearMultiBodyForces()
{
              {
                BT_PROFILE("clearMultiBodyForces");
                for (int i=0;i<this->m_multiBodies.size();i++)
                {
                        btMultiBody* bod = m_multiBodies[i];

                        bool isSleeping = false;

                        if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
                        {       
                                isSleeping = true;
                        }
                        for (int b=0;b<bod->getNumLinks();b++)
                        {       
                                if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)     
                                        isSleeping = true;
                        }

                        if (!isSleeping)
                        {
                        btMultiBody* bod = m_multiBodies[i];
                        bod->clearForcesAndTorques();
                	}
		}
	}

}